

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O2

string * __thiscall helics::FilterInfo::getSourceEndpoints_abi_cxx11_(FilterInfo *this)

{
  string *this_00;
  pointer pEVar1;
  pointer pEVar2;
  string local_50;
  
  this_00 = &this->sourceEpts;
  if ((this->sourceEpts)._M_string_length == 0) {
    pEVar2 = (this->sourceEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->sourceEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pEVar2 != pEVar1) {
      if ((long)pEVar1 - (long)pEVar2 == 0x48) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar2->key)
        ;
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
        pEVar1 = (this->sourceEndpoints).
                 super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pEVar2 = (this->sourceEndpoints).
                      super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1;
            pEVar2 = pEVar2 + 1) {
          generateJsonQuotedString(&local_50,(string *)&pEVar2->key);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_50);
          std::__cxx11::string::~string((string *)&local_50);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,','
                   );
        }
        (this->sourceEpts)._M_dataplus._M_p[(this->sourceEpts)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& FilterInfo::getSourceEndpoints() const
{
    if (sourceEpts.empty()) {
        if (!sourceEndpoints.empty()) {
            if (sourceEndpoints.size() == 1) {
                sourceEpts = sourceEndpoints.front().key;
            } else {
                sourceEpts.push_back('[');
                for (const auto& src : sourceEndpoints) {
                    sourceEpts.append(generateJsonQuotedString(src.key));
                    sourceEpts.push_back(',');
                }
                sourceEpts.back() = ']';
            }
        }
    }
    return sourceEpts;
}